

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

uint32_t __thiscall Buffer::CopyAndRemove(Buffer *this,char *out,uint32_t l)

{
  BufferChain *pBVar1;
  uint16_t uVar2;
  char *pcVar3;
  BufferChain *bc_1;
  BufferChain *bc;
  BufferChain *pBStack_28;
  uint16_t canReadCount;
  BufferChain *buff;
  uint32_t ret;
  uint32_t l_local;
  char *out_local;
  Buffer *this_local;
  
  buff._0_4_ = 0;
  pBStack_28 = this->m_head;
  buff._4_4_ = l;
  do {
    while( true ) {
      if (pBStack_28 == (BufferChain *)0x0) goto LAB_00108170;
      uVar2 = BufferChain::GetCanReadCount(pBStack_28);
      if (uVar2 != 0) break;
      pBVar1 = pBStack_28->nextpkt;
      (*this->_vptr_Buffer[1])(this,pBStack_28);
      this->m_head = pBVar1;
      pBStack_28 = pBVar1;
    }
    if (buff._4_4_ < uVar2) {
      pcVar3 = BufferChain::GetReadAddr(pBStack_28);
      memcpy(out + (uint32_t)buff,pcVar3,(ulong)buff._4_4_);
      buff._0_4_ = buff._4_4_ + (uint32_t)buff;
      this->len = this->len - buff._4_4_;
      pBStack_28->read = pBStack_28->read + (short)buff._4_4_;
      break;
    }
    pcVar3 = BufferChain::GetReadAddr(pBStack_28);
    memcpy(out + (uint32_t)buff,pcVar3,(ulong)uVar2);
    buff._0_4_ = uVar2 + (uint32_t)buff;
    buff._4_4_ = buff._4_4_ - uVar2;
    this->len = this->len - (uint)uVar2;
    pBVar1 = pBStack_28->nextpkt;
    (*this->_vptr_Buffer[1])(this,pBStack_28);
    this->m_head = pBVar1;
    pBStack_28 = pBVar1;
  } while (buff._4_4_ != 0);
LAB_00108170:
  if (this->m_head == (BufferChain *)0x0) {
    this->m_end = (BufferChain *)0x0;
  }
  return (uint32_t)buff;
}

Assistant:

uint32_t Buffer::CopyAndRemove(char *out, uint32_t l)
{
    uint32_t ret = 0;
    for(BufferChain* buff = this->m_head; buff != nullptr;)
    {
        uint16_t canReadCount = buff->GetCanReadCount();
        if(canReadCount == 0)
        {
            BufferChain* bc = buff->nextpkt;
            Cycle(buff);
            buff = bc;
            m_head = bc;
            continue;
        }

        if(l < canReadCount)
        {
            memcpy(out + ret, buff->GetReadAddr(), l);
            ret += l;
            len -= l;
            buff->read += l;
            break;
        }
        else
        {
            memcpy(out + ret, buff->GetReadAddr(), canReadCount);
            ret += canReadCount;
            l -= canReadCount;
            len -= canReadCount;

            BufferChain* bc = buff->nextpkt;
            Cycle(buff);
            buff = bc;
            m_head = bc;

            if(l == 0)
                break;
        }

    }

    if(m_head == nullptr)
        m_end = nullptr;

    return ret;
}